

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  ushort uVar3;
  NameContext *pNVar4;
  Parse *pPVar5;
  SrcList *pSVar6;
  AggInfo *pAVar7;
  ExprList *pEVar8;
  Expr *pEVar9;
  sqlite3 *db;
  char *z;
  AggInfo_col *pAVar10;
  AggInfo_func *pAVar11;
  FuncDef *pFVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  ExprList_item *pEVar18;
  int iVar19;
  AggInfo_func *pAVar20;
  int local_38;
  int local_34;
  
  pNVar4 = (pWalker->u).pNC;
  pPVar5 = pNVar4->pParse;
  pSVar6 = pNVar4->pSrcList;
  pAVar7 = pNVar4->pAggInfo;
  uVar1 = pExpr->op;
  if (uVar1 != 0x9a) {
    if (uVar1 == 0x99) {
      if ((pNVar4->ncFlags & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      pAVar11 = pAVar7->aFunc;
      uVar15 = 0;
      pAVar20 = pAVar11;
      iVar14 = pAVar7->nFunc;
      if (pAVar7->nFunc < 1) {
        iVar14 = 0;
      }
      for (; iVar14 != (int)uVar15; uVar15 = (ulong)((int)uVar15 + 1)) {
        iVar19 = sqlite3ExprCompare(pAVar20->pExpr,pExpr);
        if (iVar19 == 0) goto LAB_0015eaba;
        pAVar20 = pAVar20 + 1;
      }
      uVar1 = pPVar5->db->aDb->pSchema->enc;
      pAVar11 = (AggInfo_func *)
                sqlite3ArrayAllocate(pPVar5->db,pAVar11,0x18,&pAVar7->nFunc,&local_34);
      pAVar7->aFunc = pAVar11;
      uVar15 = (ulong)local_34;
      if (-1 < (long)uVar15) {
        pAVar11[uVar15].pExpr = pExpr;
        iVar14 = pPVar5->nMem + 1;
        pPVar5->nMem = iVar14;
        pAVar11[uVar15].iMem = iVar14;
        db = pPVar5->db;
        z = (pExpr->u).zToken;
        iVar14 = sqlite3Strlen30(z);
        if ((pExpr->x).pList == (ExprList *)0x0) {
          iVar19 = 0;
        }
        else {
          iVar19 = ((pExpr->x).pList)->nExpr;
        }
        pFVar12 = sqlite3FindFunction(db,z,iVar14,iVar19,uVar1,'\0');
        pAVar11[uVar15].pFunc = pFVar12;
        if ((pExpr->flags & 0x10) == 0) {
          iVar14 = -1;
        }
        else {
          iVar14 = pPVar5->nTab;
          pPVar5->nTab = iVar14 + 1;
        }
        pAVar11[uVar15].iDistinct = iVar14;
      }
LAB_0015eaba:
      pExpr->iAgg = (i16)uVar15;
      pExpr->pAggInfo = pAVar7;
      return 1;
    }
    if (uVar1 != 0x98) {
      return 0;
    }
  }
  if (pSVar6 != (SrcList *)0x0) {
    uVar3 = pSVar6->nSrc;
    lVar13 = 0;
    if ((short)uVar3 < 1) {
      uVar3 = 0;
    }
    for (; (uint)uVar3 * 0x68 != (int)lVar13; lVar13 = lVar13 + 0x68) {
      if (pExpr->iTable == *(int *)((long)&pSVar6->a[0].iCursor + lVar13)) {
        uVar15 = 0;
        iVar14 = pAVar7->nColumn;
        if (pAVar7->nColumn < 1) {
          iVar14 = 0;
        }
        piVar17 = &pAVar7->aCol->iColumn;
        goto LAB_0015e92c;
      }
    }
  }
  return 1;
LAB_0015e92c:
  if (iVar14 == (int)uVar15) goto LAB_0015e94c;
  if ((piVar17[-1] == pExpr->iTable) && (*piVar17 == (int)pExpr->iColumn)) goto LAB_0015e9f7;
  uVar15 = (ulong)((int)uVar15 + 1);
  piVar17 = piVar17 + 8;
  goto LAB_0015e92c;
LAB_0015e94c:
  pAVar10 = (AggInfo_col *)
            sqlite3ArrayAllocate(pPVar5->db,pAVar7->aCol,0x20,&pAVar7->nColumn,&local_38);
  pAVar7->aCol = pAVar10;
  uVar15 = (ulong)local_38;
  if (-1 < (long)uVar15) {
    pAVar10[uVar15].pTab = pExpr->pTab;
    iVar14 = pExpr->iTable;
    pAVar10[uVar15].iTable = iVar14;
    sVar2 = pExpr->iColumn;
    pAVar10[uVar15].iColumn = (int)sVar2;
    iVar19 = pPVar5->nMem + 1;
    pPVar5->nMem = iVar19;
    pAVar10[uVar15].iMem = iVar19;
    pAVar10[uVar15].pExpr = pExpr;
    pEVar8 = pAVar7->pGroupBy;
    if (pEVar8 != (ExprList *)0x0) {
      pEVar18 = pEVar8->a;
      iVar19 = pEVar8->nExpr;
      iVar16 = 0;
      if (iVar19 < 1) {
        iVar19 = 0;
        iVar16 = 0;
      }
      for (; iVar19 != iVar16; iVar16 = iVar16 + 1) {
        pEVar9 = pEVar18->pExpr;
        if (((pEVar9->op == 0x98) && (pEVar9->iTable == iVar14)) && (pEVar9->iColumn == sVar2))
        goto LAB_0015e9f4;
        pEVar18 = pEVar18 + 1;
      }
    }
    iVar16 = pAVar7->nSortingColumn;
    pAVar7->nSortingColumn = iVar16 + 1;
LAB_0015e9f4:
    pAVar10[uVar15].iSorterColumn = iVar16;
  }
LAB_0015e9f7:
  pExpr->pAggInfo = pAVar7;
  pExpr->op = 0x9a;
  pExpr->iAgg = (i16)uVar15;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetIrreducible(pExpr);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(pItem->pExpr, pExpr)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, sqlite3Strlen30(pExpr->u.zToken),
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetIrreducible(pExpr);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}